

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*,bool)::LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
          (void *this,FieldDescriptor *field)

{
  int iVar1;
  iterator __position;
  Printer *this_00;
  long *plVar2;
  int i;
  uint uVar3;
  FieldDescriptor *local_50;
  string local_48;
  int iVar4;
  
  local_50 = field;
  if ((*(char *)((long)this + 0x11) != '\0') ||
     ((*(long **)((long)this + 0x18) != *(long **)((long)this + 0x20) &&
      (*(long *)(**(long **)((long)this + 0x18) + 0x60) != *(long *)(field + 0x60))))) {
    GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush
              ((LazySerializerEmitter *)this);
  }
  if (*(long *)(field + 0x60) == 0) {
    if (((*(char *)(*(long *)(field + 0x80) + 0x6f) == '\0') && (*(int *)(field + 0x4c) != 3)) &&
       (*(char *)((long)this + 0x11) == '\0')) {
      if (field[0x50] == (FieldDescriptor)0x0) {
        plVar2 = (long *)(*(long *)(field + 0x58) + 0x30);
      }
      else if (*(long *)(field + 0x68) == 0) {
        plVar2 = (long *)(*(long *)(field + 0x30) + 0x98);
      }
      else {
        plVar2 = (long *)(*(long *)(field + 0x68) + 0x80);
      }
      i = (int)((ulong)((long)field - *plVar2) >> 3);
      iVar1 = *(int *)(*(long *)(*this + 0xc0) + (long)(i * 0x3cf3cf3d) * 4);
      iVar4 = iVar1 + 0x1f;
      if (-1 < iVar1) {
        iVar4 = iVar1;
      }
      uVar3 = iVar4 >> 5;
      if (*(uint *)((long)this + 0x30) != uVar3) {
        this_00 = *(Printer **)((long)this + 8);
        SimpleItoa_abi_cxx11_(&local_48,(protobuf *)(ulong)uVar3,i);
        protobuf::io::Printer::Print
                  (this_00,"cached_has_bits = _has_bits_[$new_index$];\n","new_index",&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        *(uint *)((long)this + 0x30) = uVar3;
      }
    }
    GenerateSerializeOneField
              (*this,*(Printer **)((long)this + 8),field,*(bool *)((long)this + 0x10),
               *(int *)((long)this + 0x30));
  }
  else {
    __position._M_current = *(FieldDescriptor ***)((long)this + 0x20);
    if (__position._M_current == *(FieldDescriptor ***)((long)this + 0x28)) {
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)((long)this + 0x18),__position,&local_50);
    }
    else {
      *__position._M_current = field;
      *(long *)((long)this + 0x20) = *(long *)((long)this + 0x20) + 8;
    }
  }
  return;
}

Assistant:

void Emit(const FieldDescriptor* field) {
      if (eager_ || MustFlush(field)) {
        Flush();
      }
      if (field->containing_oneof() == NULL) {
        // TODO(ckennelly): Defer non-oneof fields similarly to oneof fields.

        if (!field->options().weak() && !field->is_repeated() && !eager_) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;

            printer_->Print(
                "cached_has_bits = _has_bits_[$new_index$];\n",
                "new_index", SimpleItoa(new_index));

            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(
            printer_, field, to_array_, cached_has_bit_index_);
      } else {
        v_.push_back(field);
      }
    }